

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O3

void Eigen::internal::
     generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
     ::scaleAndAddTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,Matrix<double,__1,__1,_0,__1,__1> *a_lhs,
               Matrix<double,__1,__1,_0,__1,__1> *a_rhs,Scalar *alpha)

{
  Scalar SVar1;
  BlockingType blocking;
  gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> local_88;
  gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false>_>
  local_48;
  
  local_88.super_level3_blocking<double,_double>.m_mc =
       (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if ((local_88.super_level3_blocking<double,_double>.m_mc ==
       (a_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows)
     && (local_88.super_level3_blocking<double,_double>.m_nc =
              (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols,
        local_88.super_level3_blocking<double,_double>.m_nc ==
        (a_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols))
  {
    if (((local_88.super_level3_blocking<double,_double>.m_nc != 0) &&
        (local_88.super_level3_blocking<double,_double>.m_mc != 0)) &&
       (local_88.super_level3_blocking<double,_double>.m_kc =
             (a_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols, local_88.super_level3_blocking<double,_double>.m_kc != 0)) {
      SVar1 = *alpha;
      local_88.super_level3_blocking<double,_double>.m_blockA = (LhsScalar *)0x0;
      local_88.super_level3_blocking<double,_double>.m_blockB = (RhsScalar *)0x0;
      evaluateProductBlockingSizesHeuristic<double,double,1,long>
                (&local_88.super_level3_blocking<double,_double>.m_kc,
                 &local_88.super_level3_blocking<double,_double>.m_mc,
                 &local_88.super_level3_blocking<double,_double>.m_nc,1);
      local_88.m_sizeA =
           local_88.super_level3_blocking<double,_double>.m_mc *
           local_88.super_level3_blocking<double,_double>.m_kc;
      local_88.m_sizeB =
           local_88.super_level3_blocking<double,_double>.m_kc *
           local_88.super_level3_blocking<double,_double>.m_nc;
      local_48.m_blocking = &local_88;
      local_48.m_lhs = a_lhs;
      local_48.m_rhs = a_rhs;
      local_48.m_dest = dst;
      local_48.m_actualAlpha = SVar1;
      gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>_>
      ::operator()(&local_48,0,
                   (a_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows,0,
                   (a_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_cols,(GemmParallelInfo<long> *)0x0);
      free(local_88.super_level3_blocking<double,_double>.m_blockA);
      free(local_88.super_level3_blocking<double,_double>.m_blockB);
    }
    return;
  }
  __assert_fail("dst.rows()==a_lhs.rows() && dst.cols()==a_rhs.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/products/GeneralMatrixMatrix.h"
                ,0x1cc,
                "static void Eigen::internal::generic_product_impl<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, Eigen::DenseShape, Eigen::DenseShape, 8>::scaleAndAddTo(Dest &, const Lhs &, const Rhs &, const Scalar &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, LhsShape = Eigen::DenseShape, RhsShape = Eigen::DenseShape, ProductType = 8, Dest = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

~gemm_blocking_space()
    {
      aligned_delete(this->m_blockA, m_sizeA);
      aligned_delete(this->m_blockB, m_sizeB);
    }